

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

shared_ptr<kratos::InitialStmtBlock> __thiscall kratos::Generator::initial(Generator *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Generator *in_RSI;
  shared_ptr<kratos::InitialStmtBlock> sVar1;
  shared_ptr<kratos::Stmt> local_30;
  undefined1 local_19;
  Generator *this_local;
  shared_ptr<kratos::InitialStmtBlock> *stmt;
  
  local_19 = 0;
  this_local = this;
  std::make_shared<kratos::InitialStmtBlock>();
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::InitialStmtBlock,void>
            (&local_30,(shared_ptr<kratos::InitialStmtBlock> *)this);
  add_stmt(in_RSI,&local_30);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_30);
  sVar1.super___shared_ptr<kratos::InitialStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<kratos::InitialStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::InitialStmtBlock>)
         sVar1.super___shared_ptr<kratos::InitialStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<InitialStmtBlock> Generator::initial() {
    auto stmt = std::make_shared<InitialStmtBlock>();
    add_stmt(stmt);
    return stmt;
}